

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,FunctionCallNode *node)

{
  bool bVar1;
  string *psVar2;
  reference_wrapper<RuntimeSymbol> *this_00;
  RuntimeSymbol *pRVar3;
  Executor *in_RSI;
  RuntimeVariableAnalyser variableAnalyser;
  RuntimeFunctionAnalyser functionAnalyser;
  optional<std::reference_wrapper<RuntimeSymbol>_> symbol;
  string name;
  RuntimeVariableAnalyser *in_stack_00000160;
  FunctionCallNode *in_stack_00000168;
  Executor *in_stack_00000170;
  char *in_stack_fffffffffffffee8;
  RuntimeFunctionAnalyser *in_stack_fffffffffffffef0;
  undefined1 local_c8 [12];
  int in_stack_ffffffffffffff44;
  string *in_stack_ffffffffffffff48;
  Context *in_stack_ffffffffffffff50;
  undefined1 local_90 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa8;
  Executor *in_stack_ffffffffffffffb0;
  FunctionCallNode *in_stack_ffffffffffffffc8;
  Executor *in_stack_ffffffffffffffd0;
  RuntimeFunctionAnalyser *in_stack_ffffffffffffffe0;
  FunctionCallNode *in_stack_ffffffffffffffe8;
  
  psVar2 = FunctionCallNode::getName_abi_cxx11_((FunctionCallNode *)in_RSI);
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,(string *)psVar2);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (bVar1) {
    handlePrint(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (bVar1) {
      handleIf(in_stack_ffffffffffffffb0,(FunctionCallNode *)in_stack_ffffffffffffffa8._M_pi);
    }
    else {
      Context::lookup(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44)
      ;
      RuntimeFunctionAnalyser::RuntimeFunctionAnalyser(in_stack_fffffffffffffef0);
      this_00 = std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                          ((optional<std::reference_wrapper<RuntimeSymbol>_> *)
                           in_stack_fffffffffffffef0);
      pRVar3 = std::reference_wrapper<RuntimeSymbol>::get(this_00);
      (*pRVar3->_vptr_RuntimeSymbol[2])(pRVar3,local_90);
      bVar1 = RuntimeFunctionAnalyser::isSymbolValid((RuntimeFunctionAnalyser *)local_90);
      if (bVar1) {
        handleFunctionCall(in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
      }
      else {
        RuntimeVariableAnalyser::RuntimeVariableAnalyser
                  ((RuntimeVariableAnalyser *)in_stack_fffffffffffffef0);
        in_stack_fffffffffffffef0 =
             (RuntimeFunctionAnalyser *)
             std::optional<std::reference_wrapper<RuntimeSymbol>_>::value
                       ((optional<std::reference_wrapper<RuntimeSymbol>_> *)
                        in_stack_fffffffffffffef0);
        pRVar3 = std::reference_wrapper<RuntimeSymbol>::get
                           ((reference_wrapper<RuntimeSymbol> *)in_stack_fffffffffffffef0);
        (*pRVar3->_vptr_RuntimeSymbol[2])(pRVar3,local_c8);
        handleVariableCall(in_stack_00000170,in_stack_00000168,in_stack_00000160);
        RuntimeVariableAnalyser::~RuntimeVariableAnalyser
                  ((RuntimeVariableAnalyser *)in_stack_fffffffffffffef0);
      }
      RuntimeFunctionAnalyser::~RuntimeFunctionAnalyser(in_stack_fffffffffffffef0);
    }
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void Executor::visit(const FunctionCallNode& node)
{
  const auto name = node.getName();
  if(name == "print")
    handlePrint(node);
  else if(name == "if")
    handleIf(node);
  else
  {
    const auto symbol = context_.lookup(name);
    auto functionAnalyser = RuntimeFunctionAnalyser{};
    symbol.value().get().accept(functionAnalyser);

    if(functionAnalyser.isSymbolValid())
    {
      handleFunctionCall(node, functionAnalyser);
    }
    else
    {
      auto variableAnalyser = RuntimeVariableAnalyser{};
      symbol.value().get().accept(variableAnalyser);
      handleVariableCall(node, variableAnalyser);
    }
  }
}